

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GIC.h
# Opt level: O0

void __thiscall
Gudhi::cover_complex::Cover_complex<std::vector<float,_std::allocator<float>_>_>::
compute_pairwise_distances<Gudhi::Euclidean_distance>
          (Cover_complex<std::vector<float,_std::allocator<float>_>_> *this)

{
  ostream *poVar1;
  reference p1;
  reference p2;
  reference pvVar2;
  reference pvVar3;
  int iVar4;
  value_type vVar5;
  double dis;
  int j;
  int state;
  int i_1;
  int i;
  allocator<double> local_31;
  undefined1 local_30 [8];
  vector<double,_std::allocator<double>_> zeros;
  Cover_complex<std::vector<float,_std::allocator<float>_>_> *this_local;
  
  iVar4 = this->num_points;
  zeros.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::allocator<double>::allocator(&local_31);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_30,(long)iVar4,&local_31);
  std::allocator<double>::~allocator(&local_31);
  for (state = 0; state < this->num_points; state = state + 1) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&this->distances,(value_type *)local_30);
  }
  if ((this->verbose & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::clog,"Computing distances...");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (j = 0; j < this->num_points; j = j + 1) {
    iVar4 = ((j + 1) * 100) / this->num_points;
    if (((this->verbose & 1U) != 0) && (iVar4 % 10 == 0)) {
      poVar1 = std::operator<<((ostream *)&std::clog,"\r");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
      poVar1 = std::operator<<(poVar1,"%");
      std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
    }
    for (dis._4_4_ = j; dis._4_4_ < this->num_points; dis._4_4_ = dis._4_4_ + 1) {
      p1 = std::
           vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ::operator[](&this->point_cloud,(long)j);
      p2 = std::
           vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ::operator[](&this->point_cloud,(long)dis._4_4_);
      vVar5 = Euclidean_distance::operator()((Euclidean_distance *)((long)&this_local + 7),p1,p2);
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->distances,(long)j);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(long)dis._4_4_);
      *pvVar3 = (double)vVar5;
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->distances,(long)dis._4_4_);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(long)j);
      *pvVar3 = (double)vVar5;
    }
  }
  if ((this->verbose & 1U) != 0) {
    std::ostream::operator<<(&std::clog,std::endl<char,std::char_traits<char>>);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_30);
  return;
}

Assistant:

void compute_pairwise_distances(Distance ref_distance) {
    std::vector<double> zeros(this->num_points);
    for (int i = 0; i < this->num_points; i++) distances.push_back(zeros);
    if (verbose) std::clog << "Computing distances..." << std::endl;
    for (int i = 0; i < this->num_points; i++) {
      int state = 100 * (i + 1) / this->num_points;
      if (verbose && state % 10 == 0) std::clog << "\r" << state << "%" << std::flush;
      for (int j = i; j < this->num_points; j++) {
        double dis = ref_distance(point_cloud[i], point_cloud[j]);
        distances[i][j] = dis;
        distances[j][i] = dis;
      }
    }
    if (verbose) std::clog << std::endl;
  }